

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MaskInvertCase::drawPattern
          (MaskInvertCase *this,bool invert)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  deUint32 err;
  undefined4 extraout_var;
  int iVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float __x;
  Vec4 color;
  Vec2 local_60;
  Vec2 local_58;
  Vec4 local_50;
  DefaultFBOMultisampleCase *local_40;
  Vec2 local_38;
  
  iVar1 = (*((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  iVar8 = 0;
  local_40 = &this->super_DefaultFBOMultisampleCase;
  do {
    fVar10 = (float)iVar8;
    fVar11 = fVar10 / 25.0;
    local_50.m_data[0] = fVar11 * 0.6 + 0.4;
    local_50.m_data[1] = fVar11 * 0.3 + 0.5;
    local_50.m_data[2] = 0.6 - fVar11 * 0.5;
    local_50.m_data[3] = 0.7 - fVar11 * 0.7;
    iVar4 = (this->super_DefaultFBOMultisampleCase).m_numSamples;
    uVar5 = iVar4 - 1;
    uVar2 = iVar4 + 0x1e;
    if (-1 < (int)uVar5) {
      uVar2 = uVar5;
    }
    iVar4 = iVar4 - (uVar2 & 0xffffffe0);
    if (-0x20 < (int)uVar5) {
      uVar9 = 0;
      iVar6 = 0;
      do {
        uVar5 = ((uint)(uVar9 >> 0x10) ^ (int)uVar9 + iVar8 ^ 0x3d) * 9;
        uVar3 = (uVar5 >> 4 ^ uVar5) * 0x27d4eb2d;
        iVar7 = iVar6 + 1;
        uVar5 = 0xffffffff;
        if ((int)uVar2 >> 5 == iVar6) {
          uVar5 = ~(-1 << ((byte)iVar4 & 0x1f));
        }
        if (0x1f < iVar4) {
          uVar5 = 0xffffffff;
        }
        (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1258))
                  (iVar6,uVar5 & (uVar3 >> 0xf ^ -(int)CONCAT71(in_register_00000031,invert) ^ uVar3
                                 ));
        uVar9 = (ulong)((int)uVar9 + 0x20);
        iVar6 = iVar7;
      } while (((int)uVar2 >> 5) + 1 != iVar7);
    }
    __x = (fVar10 * 6.2831855) / 25.0;
    fVar11 = ((fVar10 + 0.5) * 6.2831855) / 25.0;
    err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
    glu::checkError(err,"glSampleMaski",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x20b);
    local_38.m_data[0] = 0.0;
    local_38.m_data[1] = 0.0;
    fVar10 = cosf(__x);
    local_58.m_data[1] = sinf(__x);
    local_58.m_data[1] = local_58.m_data[1] * 0.95;
    local_58.m_data[0] = fVar10 * 0.95;
    fVar10 = cosf(fVar11);
    local_60.m_data[1] = sinf(fVar11);
    this = (MaskInvertCase *)local_40;
    local_60.m_data[1] = local_60.m_data[1] * 0.95;
    local_60.m_data[0] = fVar10 * 0.95;
    DefaultFBOMultisampleCase::renderTriangle
              (local_40,&local_38,&local_58,&local_60,&local_50,&local_50,&local_50);
    iVar8 = iVar8 + 1;
  } while (iVar8 != 0x19);
  return;
}

Assistant:

void MaskInvertCase::drawPattern (bool invert) const
{
	const int				numTriangles	= 25;
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();

	for (int triNdx = 0; triNdx < numTriangles; triNdx++)
	{
		const float	angle0	= 2.0f*DE_PI * (float)triNdx			/ (float)numTriangles;
		const float	angle1	= 2.0f*DE_PI * ((float)triNdx + 0.5f)	/ (float)numTriangles;
		const Vec4	color	= Vec4(0.4f + (float)triNdx/(float)numTriangles*0.6f,
		                           0.5f + (float)triNdx/(float)numTriangles*0.3f,
		                           0.6f - (float)triNdx/(float)numTriangles*0.5f,
		                           0.7f - (float)triNdx/(float)numTriangles*0.7f);


		const int			wordCount		= getEffectiveSampleMaskWordCount(m_numSamples - 1);
		const GLbitfield	finalWordBits	= m_numSamples - 32 * ((m_numSamples-1) / 32);
		const GLbitfield	finalWordMask	= (GLbitfield)deBitMask32(0, (int)finalWordBits);

		for (int wordNdx = 0; wordNdx < wordCount; ++wordNdx)
		{
			const GLbitfield	rawMask		= (GLbitfield)deUint32Hash(wordNdx * 32 + triNdx);
			const GLbitfield	mask		= (invert) ? (~rawMask) : (rawMask);
			const bool			isFinalWord	= (wordNdx + 1) == wordCount;
			const GLbitfield	maskMask	= (isFinalWord) ? (finalWordMask) : (0xFFFFFFFFUL); // maskMask prevents setting coverage bits higher than sample count

			gl.sampleMaski(wordNdx, mask & maskMask);
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "glSampleMaski");

		renderTriangle(Vec2(0.0f, 0.0f),
					   Vec2(deFloatCos(angle0)*0.95f, deFloatSin(angle0)*0.95f),
					   Vec2(deFloatCos(angle1)*0.95f, deFloatSin(angle1)*0.95f),
					   color);
	}
}